

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuidpp.cpp
# Opt level: O1

string * __thiscall cpuidpp::CPUIDImpl::query_vendor_abi_cxx11_(CPUIDImpl *this)

{
  int *piVar1;
  int iVar2;
  uint value;
  uint value_00;
  uint value_01;
  string local_50;
  
  if ((this->vendor)._M_string_length == 0) {
    piVar1 = (int *)cpuid_basic_info(0);
    iVar2 = *piVar1;
    value = piVar1[1];
    value_00 = piVar1[2];
    value_01 = piVar1[3];
    if (iVar2 == 0) {
      value_00 = 0;
      value_01 = 0;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::reserve((ulong)&local_50);
    if (iVar2 == 0) {
      value = 0;
    }
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value,&local_50);
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value_00,&local_50);
    anon_unknown_2::ExtractChar<unsigned_int,_4UL,_4UL>::fill(value_01,&local_50);
    std::__cxx11::string::operator=((string *)&this->vendor,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  return &this->vendor;
}

Assistant:

const std::string& query_vendor() const
    {
        if (vendor.empty()) {
            std::array<unsigned, 4> info{};
            // EAX=0
            cpuid(info.data(), 0);

            vendor = ExtractCharsFromArray<1, 3, 2>::extract(info);
        }

        return vendor;
    }